

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O2

void host_vendor_fms_x86_64(char *vendor,int *family,int *model,int *stepping)

{
  uint *puVar1;
  uint uVar2;
  
  cpuid_basic_info(0);
  puVar1 = (uint *)cpuid_Version_info(1);
  uVar2 = *puVar1;
  if (family != (int *)0x0) {
    *family = (uVar2 >> 0x14 & 0xff) + (uVar2 >> 8 & 0xf);
  }
  if (model != (int *)0x0) {
    *model = uVar2 >> 0xc & 0xf0 | uVar2 >> 4 & 0xf;
  }
  if (stepping != (int *)0x0) {
    *stepping = uVar2 & 0xf;
  }
  return;
}

Assistant:

void host_vendor_fms(char *vendor, int *family, int *model, int *stepping)
{
    uint32_t eax, ebx, ecx, edx;

    host_cpuid(0x0, 0, &eax, &ebx, &ecx, &edx);

    host_cpuid(0x1, 0, &eax, &ebx, &ecx, &edx);
    if (family) {
        *family = ((eax >> 8) & 0x0F) + ((eax >> 20) & 0xFF);
    }
    if (model) {
        *model = ((eax >> 4) & 0x0F) | ((eax & 0xF0000) >> 12);
    }
    if (stepping) {
        *stepping = eax & 0x0F;
    }
}